

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

void Wln_NtkStartFaninMap(Wln_Ntk_t *p,Vec_Int_t *vFaninMap,int nMulti)

{
  int iVar1;
  int Fill;
  long lVar2;
  long lVar3;
  int Entry;
  
  Entry = (p->vTypes).nSize;
  iVar1 = Wln_NtkFaninNum(p);
  Vec_IntFill(vFaninMap,iVar1 * nMulti + Entry,Fill);
  lVar3 = 0x14;
  for (lVar2 = 1; lVar2 < (p->vTypes).nSize; lVar2 = lVar2 + 1) {
    Vec_IntWriteEntry(vFaninMap,(int)lVar2,Entry);
    Entry = Entry + *(int *)((long)&p->vFanins->nCap + lVar3) * nMulti;
    lVar3 = lVar3 + 0x10;
  }
  if (Entry == vFaninMap->nSize) {
    return;
  }
  __assert_fail("iOffset == Vec_IntSize(vFaninMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                ,0x17d,"void Wln_NtkStartFaninMap(Wln_Ntk_t *, Vec_Int_t *, int)");
}

Assistant:

void Wln_NtkStartFaninMap( Wln_Ntk_t * p, Vec_Int_t * vFaninMap, int nMulti )
{
    int iObj, iOffset = Wln_NtkObjNum(p);
    Vec_IntFill( vFaninMap, iOffset + nMulti * Wln_NtkFaninNum(p), 0 );
    Wln_NtkForEachObj( p, iObj )
    {
        Vec_IntWriteEntry( vFaninMap, iObj, iOffset );
        iOffset += nMulti * Wln_ObjFaninNum(p, iObj);
    }
    assert( iOffset == Vec_IntSize(vFaninMap) );
}